

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Type __thiscall capnp::StructSchema::Field::getType(Field *this)

{
  uint uVar1;
  void *pvVar2;
  Reader proto;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  short sVar4;
  uint location;
  uint64_t id;
  Type TVar5;
  PointerReader local_68;
  StructReader local_48;
  
  pvVar2 = (this->proto)._reader.data;
  uVar1 = (this->proto)._reader.dataSize;
  if (uVar1 < 0x50) {
    sVar4 = 0;
  }
  else {
    sVar4 = *(short *)((long)pvVar2 + 8);
  }
  location = this->index | 0x1000000;
  if (sVar4 == 1) {
    if (uVar1 < 0xc0) {
      id = 0;
    }
    else {
      id = *(uint64_t *)((long)pvVar2 + 0x10);
    }
    local_68.segment = (SegmentReader *)Schema::getDependency((Schema *)this,id,location);
    aVar3 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&local_68);
    TVar5.field_4 =
         (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar3.schema;
    TVar5.baseType = STRUCT;
    TVar5.listDepth = '\0';
    TVar5.isImplicitParam = false;
    TVar5.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
    TVar5._6_2_ = 0;
  }
  else {
    if (sVar4 != 0) {
      kj::_::unreachable();
    }
    if ((this->proto)._reader.pointerCount < 3) {
      local_68.nestingLimit = 0x7fffffff;
      local_68.capTable = (CapTableReader *)0x0;
      local_68.pointer = (WirePointer *)0x0;
      local_68.segment = (SegmentReader *)0x0;
    }
    else {
      local_68.segment = (this->proto)._reader.segment;
      local_68.capTable = (this->proto)._reader.capTable;
      local_68.nestingLimit = (this->proto)._reader.nestingLimit;
      local_68.pointer = (this->proto)._reader.pointers + 2;
    }
    capnp::_::PointerReader::getStruct(&local_48,&local_68,(word *)0x0);
    proto._reader.capTable = local_48.capTable;
    proto._reader.segment = local_48.segment;
    proto._reader.data = local_48.data;
    proto._reader.pointers = local_48.pointers;
    proto._reader.dataSize = local_48.dataSize;
    proto._reader.pointerCount = local_48.pointerCount;
    proto._reader._38_2_ = local_48._38_2_;
    proto._reader.nestingLimit = local_48.nestingLimit;
    proto._reader._44_4_ = local_48._44_4_;
    TVar5 = Schema::interpretType((Schema *)this,proto,location);
  }
  return TVar5;
}

Assistant:

Type StructSchema::Field::getType() const {
  auto proto = getProto();
  uint location = _::RawBrandedSchema::makeDepLocation(_::RawBrandedSchema::DepKind::FIELD, index);

  switch (proto.which()) {
    case schema::Field::SLOT:
      return parent.interpretType(proto.getSlot().getType(), location);

    case schema::Field::GROUP:
      return parent.getDependency(proto.getGroup().getTypeId(), location).asStruct();
  }
  KJ_UNREACHABLE;
}